

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_cpu.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  char *format;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ALLEGRO_EVENT event;
  int local_78;
  int local_58;
  bool bVar10;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    al_init_font_addon();
    lVar4 = al_create_display(0x280,0x1e0);
    if (lVar4 == 0) {
      format = "Error creating display.\n";
    }
    else {
      cVar1 = al_install_keyboard();
      if (cVar1 != '\0') {
        uVar5 = al_create_builtin_font();
        uVar6 = al_create_timer(0x9999999a);
        uVar7 = al_create_event_queue();
        uVar8 = al_get_keyboard_event_source();
        al_register_event_source(uVar7,uVar8);
        uVar8 = al_get_timer_event_source(uVar6);
        al_register_event_source(uVar7,uVar8);
        uVar8 = al_get_display_event_source(lVar4);
        al_register_event_source(uVar7,uVar8);
        al_start_timer(uVar6);
        bVar10 = false;
        bVar9 = false;
        al_set_blender(0,1,3);
        bVar11 = true;
        do {
          if ((bVar11) && (cVar1 = al_is_event_queue_empty(uVar7), cVar1 != '\0')) {
            al_map_rgba_f(0,0,0,0x3f800000);
            al_clear_to_color();
            uVar13 = 0x3f800000;
            uVar12 = al_map_rgba_f(0x3f800000,0x3f800000,0,0x3f800000);
            uVar2 = al_get_cpu_count();
            bVar11 = false;
            al_draw_textf(uVar12,uVar13,0x41800000,0x41800000,uVar5,0,
                          "Amount of CPU cores detected: %d.",uVar2);
            uVar14 = 0x3f800000;
            uVar15 = 0;
            uVar13 = al_map_rgba_f(0,0x3f800000,0x3f800000,0x3f800000);
            uVar2 = extraout_XMM0_Dc;
            uVar12 = al_get_ram_size();
            al_draw_textf(uVar13,uVar14,0x41800000,0x42000000,uVar5,0,
                          "Size of random access memory: %d MiB.",uVar12,in_R8,in_R9,uVar14,uVar15,
                          uVar13,uVar2);
            al_flip_display();
          }
          al_wait_for_event(uVar7);
          if (local_78 == 0x2a) {
            bVar9 = true;
            bVar10 = true;
          }
          else if (local_78 == 0x1e) {
            bVar11 = true;
          }
          else if ((local_78 == 10) && (bVar9 = bVar10, local_58 == 0x3b)) {
            bVar9 = true;
            bVar10 = bVar9;
          }
        } while (!bVar9);
        al_destroy_font(uVar5);
        return 0;
      }
      format = "Error installing keyboard.\n";
    }
  }
  abort_example(format);
  iVar3 = __cxa_atexit();
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   bool done = false;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   al_init_font_addon();
   init_platform_specific();
   

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   font = al_create_builtin_font();

   timer = al_create_timer(INTERVAL);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   while (!done) {
      ALLEGRO_EVENT event;

      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgba_f(0, 0, 0, 1.0));
         al_draw_textf(font, al_map_rgba_f(1, 1, 0, 1.0), 16, 16, 0,
                       "Amount of CPU cores detected: %d.", al_get_cpu_count());
         al_draw_textf(font, al_map_rgba_f(0, 1, 1, 1.0), 16, 32, 0, 
                       "Size of random access memory: %d MiB.", al_get_ram_size());
         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               done = true;
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;

         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
      }
   }

   al_destroy_font(font);

   return 0;
}